

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O1

U16 __thiscall USBPacket::CalcCRC16(USBPacket *this)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar4;
  pointer puVar5;
  byte bVar6;
  uint uVar7;
  uint uVar3;
  
  puVar1 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + (-2 - (long)puVar1);
  if ((pointer)0x2 < puVar4) {
    uVar3 = 0xffff;
    puVar5 = (pointer)0x2;
    do {
      bVar6 = 1;
      do {
        uVar2 = uVar3 & 0xffff;
        uVar7 = uVar2 >> 1;
        uVar3 = uVar7 ^ 0xffffa001;
        if ((((bVar6 & puVar5[(long)puVar1]) == 0 ^ (byte)uVar2) & 1) != 0) {
          uVar3 = uVar7;
        }
        bVar6 = bVar6 * '\x02';
      } while (bVar6 != 0);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar4);
    return ~(ushort)uVar3;
  }
  return 0;
}

Assistant:

U16 USBPacket::CalcCRC16() const
{
    size_t counter;
    U16 crc_register = 0xffff;
    U16 polynom = 0xA001;
    U8 shift_register, data_bit, crc_bit;

    for( counter = 2; counter < mData.size() - 2; counter++ )
    {
        for( shift_register = 0x01; shift_register > 0x00; shift_register <<= 1 )
        {
            data_bit = ( mData[ counter ] & shift_register ) ? 1 : 0;
            crc_bit = crc_register & 1;

            crc_register >>= 1;

            if( data_bit ^ crc_bit )
                crc_register ^= polynom;
        }
    }

    return ~crc_register;
}